

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFMatrix.cc
# Opt level: O1

Matrix * __thiscall QPDFMatrix::getAsMatrix(QPDFMatrix *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  Matrix *in_RDI;
  
  dVar1 = this->b;
  dVar2 = this->c;
  dVar3 = this->d;
  dVar4 = this->e;
  dVar5 = this->f;
  in_RDI->a = this->a;
  in_RDI->b = dVar1;
  in_RDI->c = dVar2;
  in_RDI->d = dVar3;
  in_RDI->e = dVar4;
  in_RDI->f = dVar5;
  return in_RDI;
}

Assistant:

QPDFObjectHandle::Matrix
QPDFMatrix::getAsMatrix() const
{
    return {a, b, c, d, e, f};
}